

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

bool str2num(SQChar *s,SQObjectPtr *res,SQInteger base)

{
  char cVar1;
  bool bVar2;
  longlong x;
  double dVar3;
  SQInteger r_1;
  SQFloat r;
  SQChar c;
  bool isfloat;
  bool iseintbase;
  SQChar *e;
  SQChar *end;
  SQInteger base_local;
  SQObjectPtr *res_local;
  SQChar *s_local;
  
  bVar2 = false;
  _r = s;
  do {
    cVar1 = *_r;
    if (cVar1 == '\0') {
LAB_00122053:
      end = (SQChar *)base;
      base_local = (SQInteger)res;
      res_local = (SQObjectPtr *)s;
      if (bVar2) {
        dVar3 = strtod(s,&e);
        if (res_local == (SQObjectPtr *)e) {
          return false;
        }
        SQObjectPtr::operator=((SQObjectPtr *)base_local,(float)dVar3);
      }
      else {
        x = strtoll(s,&e,(int)base);
        if (res_local == (SQObjectPtr *)e) {
          return false;
        }
        SQObjectPtr::operator=((SQObjectPtr *)base_local,x);
      }
      return true;
    }
    if ((cVar1 == '.') || ((base < 0xe && ((cVar1 == 'E' || (cVar1 == 'e')))))) {
      bVar2 = true;
      goto LAB_00122053;
    }
    _r = _r + 1;
  } while( true );
}

Assistant:

static bool str2num(const SQChar *s,SQObjectPtr &res,SQInteger base)
{
    SQChar *end;
    const SQChar *e = s;
    bool iseintbase = base > 13; //to fix error converting hexadecimals with e like 56f0791e
    bool isfloat = false;
    SQChar c;
    while((c = *e) != _SC('\0'))
    {
        if (c == _SC('.') || (!iseintbase && (c == _SC('E') || c == _SC('e')))) { //e and E is for scientific notation
            isfloat = true;
            break;
        }
        e++;
    }
    if(isfloat){
        SQFloat r = SQFloat(scstrtod(s,&end));
        if(s == end) return false;
        res = r;
    }
    else{
        SQInteger r = SQInteger(scstrtol(s,&end,(int)base));
        if(s == end) return false;
        res = r;
    }
    return true;
}